

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall
flatbuffers::Parser::ParseNestedFlatbuffer
          (Parser *this,Value *val,FieldDef *field,size_t fieldn,StructDef *parent_struct_def)

{
  StructDef *pSVar1;
  bool bVar2;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> t;
  size_t alignment;
  uint8_t *v;
  CheckedError *ce;
  Parser *this_00;
  size_t in_R9;
  ulong len;
  uint16_t *this_01;
  string substring;
  IDLOptions local_ac0;
  Parser nested_parser;
  
  if (*(int *)&(val->type).field_0x1c == 0x5b) {
    if (*(char *)((long)&val[0x16].type.enum_def + 3) != '\x01') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&nested_parser,
                 "cannot parse nested_flatbuffer as bytes unless --json-nested-bytes is set",
                 (allocator<char> *)&local_ac0);
      Error(this,(string *)val);
      this_00 = &nested_parser;
LAB_0010f143:
      std::__cxx11::string::~string((string *)this_00);
      goto LAB_0010f1de;
    }
    ParseAnyValue(this,val,field,fieldn,parent_struct_def,in_R9,false);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f1de;
    CheckedError::~CheckedError((CheckedError *)this);
  }
  else {
    pSVar1 = (val->type).struct_def;
    SkipAnyJsonValue(this);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f1de;
    CheckedError::~CheckedError((CheckedError *)this);
    substring._M_dataplus._M_p = (pointer)&substring.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&substring,
               (undefined1 *)
               ((long)&pSVar1[-1].reserved_ids.
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7),
               (undefined1 *)
               ((long)&(val->type).struct_def[-1].reserved_ids.
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    IDLOptions::IDLOptions(&local_ac0);
    Parser(&nested_parser,&local_ac0);
    IDLOptions::~IDLOptions(&local_ac0);
    nested_parser.root_struct_def_ = *(StructDef **)(fieldn + 0x120);
    if (nested_parser.root_struct_def_ == (StructDef *)0x0) {
      __assert_fail("field->nested_flatbuffer",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                    ,0x75e,
                    "CheckedError flatbuffers::Parser::ParseNestedFlatbuffer(Value &, FieldDef *, size_t, const StructDef *)"
                   );
    }
    SymbolTable<flatbuffers::EnumDef>::operator=
              (&nested_parser.enums_,(SymbolTable<flatbuffers::EnumDef> *)&val[3].type.fixed_length)
    ;
    IDLOptions::operator=(&nested_parser.opts,(IDLOptions *)&val[0xd].offset);
    nested_parser.uses_flexbuffers_ = (bool)val[0x18].constant.field_2._M_local_buf[8];
    nested_parser.parse_depth_counter_ = *(int *)((long)&val[0x1a].constant._M_string_length + 4);
    bVar2 = Parse(&nested_parser,substring._M_dataplus._M_p,(char **)0x0,(char *)0x0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>_>
    ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>_>
             *)&nested_parser.enums_);
    if (nested_parser.enums_.vec.
        super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        nested_parser.enums_.vec.
        super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      nested_parser.enums_.vec.
      super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           nested_parser.enums_.vec.
           super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
    if (!bVar2) {
      Error(this,(string *)val);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') {
        ~Parser(&nested_parser);
        this_00 = (Parser *)&substring;
        goto LAB_0010f143;
      }
      CheckedError::~CheckedError((CheckedError *)this);
    }
    len = (ulong)nested_parser.builder_.buf_.size_;
    alignment = FlatBufferBuilderImpl<false>::GetBufferMinAlignment(&nested_parser.builder_);
    this_01 = &val[6].type.fixed_length;
    FlatBufferBuilderImpl<false>::ForceVectorAlignment
              ((FlatBufferBuilderImpl<false> *)this_01,len,1,alignment);
    v = FlatBufferBuilderImpl<false>::GetBufferPointer(&nested_parser.builder_);
    t = FlatBufferBuilderImpl<false>::
        CreateVector<unsigned_char,_flatbuffers::Offset,_flatbuffers::Vector>
                  ((FlatBufferBuilderImpl<false> *)this_01,v,
                   (ulong)nested_parser.builder_.buf_.size_);
    NumToString<unsigned_int>((string *)&local_ac0,t.o);
    std::__cxx11::string::operator=((string *)&(field->super_Definition).file,(string *)&local_ac0);
    std::__cxx11::string::~string((string *)&local_ac0);
    ~Parser(&nested_parser);
    std::__cxx11::string::~string((string *)&substring);
  }
  *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
LAB_0010f1de:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseNestedFlatbuffer(Value &val, FieldDef *field,
                                           size_t fieldn,
                                           const StructDef *parent_struct_def) {
  if (token_ == '[') {  // backwards compat for 'legacy' ubyte buffers
    if (opts.json_nested_legacy_flatbuffers) {
      ECHECK(ParseAnyValue(val, field, fieldn, parent_struct_def, 0));
    } else {
      return Error(
          "cannot parse nested_flatbuffer as bytes unless"
          " --json-nested-bytes is set");
    }
  } else {
    auto cursor_at_value_begin = cursor_;
    ECHECK(SkipAnyJsonValue());
    std::string substring(cursor_at_value_begin - 1, cursor_ - 1);

    // Create and initialize new parser
    Parser nested_parser;
    FLATBUFFERS_ASSERT(field->nested_flatbuffer);
    nested_parser.root_struct_def_ = field->nested_flatbuffer;
    nested_parser.enums_ = enums_;
    nested_parser.opts = opts;
    nested_parser.uses_flexbuffers_ = uses_flexbuffers_;
    nested_parser.parse_depth_counter_ = parse_depth_counter_;
    // Parse JSON substring into new flatbuffer builder using nested_parser
    bool ok = nested_parser.Parse(substring.c_str(), nullptr, nullptr);

    // Clean nested_parser to avoid deleting the elements in
    // the SymbolTables on destruction
    nested_parser.enums_.dict.clear();
    nested_parser.enums_.vec.clear();

    if (!ok) { ECHECK(Error(nested_parser.error_)); }
    // Force alignment for nested flatbuffer
    builder_.ForceVectorAlignment(
        nested_parser.builder_.GetSize(), sizeof(uint8_t),
        nested_parser.builder_.GetBufferMinAlignment());

    auto off = builder_.CreateVector(nested_parser.builder_.GetBufferPointer(),
                                     nested_parser.builder_.GetSize());
    val.constant = NumToString(off.o);
  }
  return NoError();
}